

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void libcellml::findAndReplaceComponentCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  ulong uVar4;
  __shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar5;
  undefined1 local_100 [8];
  string newMath;
  string originalMath;
  XmlNodePtr rootNode;
  shared_ptr<libcellml::XmlDoc> *doc;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *__range1;
  undefined1 local_80 [8];
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  mathDocs;
  string newMathContent;
  undefined1 local_40 [3];
  bool contentModified;
  string mathContent;
  string *newName_local;
  string *oldName_local;
  ComponentPtr *component_local;
  
  mathContent.field_2._8_8_ = newName;
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  Component::math_abi_cxx11_((string *)local_40,peVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = false;
    std::__cxx11::string::string
              ((string *)
               &mathDocs.
                super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    multiRootXml((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  *)local_80,(string *)local_40);
    __end1 = std::
             vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
             ::begin((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                      *)local_80);
    doc = (shared_ptr<libcellml::XmlDoc> *)
          std::
          vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
          ::end((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                 *)local_80);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
                                       *)&doc), bVar2) {
      this = (__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
             ::operator*(&__end1);
      std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(this);
      XmlDoc::rootNode((XmlDoc *)((long)&originalMath.field_2 + 8));
      peVar5 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(originalMath.field_2._M_local_buf + 8));
      bVar2 = XmlNode::isMathmlElement(peVar5,"math");
      if (bVar2) {
        peVar5 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(originalMath.field_2._M_local_buf + 8));
        XmlNode::convertToString_abi_cxx11_((string *)((long)&newMath.field_2 + 8),peVar5);
        findAndReplaceCnUnitsNames
                  ((XmlNodePtr *)((long)&originalMath.field_2 + 8),oldName,
                   (string *)mathContent.field_2._8_8_);
        peVar5 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(originalMath.field_2._M_local_buf + 8));
        XmlNode::convertToString_abi_cxx11_((string *)local_100,peVar5);
        std::__cxx11::string::operator+=
                  ((string *)
                   &mathDocs.
                    super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_100);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_100,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&newMath.field_2 + 8));
        if (bVar2) {
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)(newMath.field_2._M_local_buf + 8));
      }
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr
                ((shared_ptr<libcellml::XmlNode> *)((long)&originalMath.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
      ::operator++(&__end1);
    }
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      Component::setMath(peVar3,(string *)
                                &mathDocs.
                                 super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               *)local_80);
    std::__cxx11::string::~string
              ((string *)
               &mathDocs.
                super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void findAndReplaceComponentCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    std::string mathContent = component->math();
    if (mathContent.empty()) {
        return;
    }
    bool contentModified = false;
    std::string newMathContent;
    std::vector<XmlDocPtr> mathDocs = multiRootXml(mathContent);
    for (const auto &doc : mathDocs) {
        auto rootNode = doc->rootNode();
        if (rootNode->isMathmlElement("math")) {
            auto originalMath = rootNode->convertToString();
            findAndReplaceCnUnitsNames(rootNode, oldName, newName);
            auto newMath = rootNode->convertToString();
            newMathContent += newMath;
            if (newMath != originalMath) {
                contentModified = true;
            }
        }
    }

    if (contentModified) {
        component->setMath(newMathContent);
    }
}